

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_sbcd_rr(m68k_info *info)

{
  build_rr(info,0x145,'\x01',0);
  return;
}

Assistant:

static void d68000_sbcd_rr(m68k_info *info)
{
	build_rr(info, M68K_INS_SBCD, 1, 0);
}